

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_tec_movie_frame(REF_GRID ref_grid,char *zone_title)

{
  REF_INT node0;
  int iVar1;
  REF_GATHER pRVar2;
  REF_CELL pRVar3;
  REF_GEOM pRVar4;
  double dVar5;
  uint uVar6;
  REF_STATUS RVar7;
  FILE *pFVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  REF_NODE pRVar13;
  long lVar14;
  REF_LONG RVar15;
  undefined8 uVar16;
  REF_GLOB *pRVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  REF_GATHER ref_gather;
  int iVar22;
  int iVar23;
  ulong uVar24;
  double dVar25;
  ulong uStackY_1d0;
  REF_INT part;
  REF_MPI local_1b0;
  REF_INT nnode_1;
  REF_NODE local_1a0;
  REF_NODE local_198;
  char *local_190;
  ulong local_188;
  void *local_180;
  REF_GLOB *local_178;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  double local_160;
  REF_DBL *local_158;
  REF_LONG ncell;
  long local_148;
  REF_LONG local_140;
  REF_DBL edge_ratio;
  REF_EDGE ref_edge;
  REF_DBL quality;
  REF_DBL dot;
  REF_INT nodes_1 [27];
  REF_INT nodes [27];
  
  pRVar2 = ref_grid->gather;
  if (pRVar2->recording == 0) {
    return 0;
  }
  pRVar13 = ref_grid->node;
  pRVar3 = ref_grid->cell[3];
  pRVar4 = ref_grid->geom;
  local_190 = zone_title;
  if ((ref_grid->mpi->id == 0) && (pRVar2->hist_file == (FILE *)0x0)) {
    pFVar8 = fopen("ref_gather_histo.tec","w");
    pRVar2->hist_file = (FILE *)pFVar8;
    if (pFVar8 != (FILE *)0x0) {
LAB_0016a1d2:
      fwrite("title=\"tecplot refine histogram\"\n",0x21,1,pFVar8);
      fwrite("variables = \"Edge Length\" \"Normalized Count\"\n",0x2d,1,(FILE *)pRVar2->hist_file);
      goto LAB_0016a207;
    }
    puts("unable to open ref_gather_histo.tec");
    pFVar8 = (FILE *)pRVar2->hist_file;
    if (pFVar8 != (FILE *)0x0) goto LAB_0016a1d2;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x348,
           "ref_gather_tec_histogram_frame","unable to open file");
    uStackY_1d0 = 2;
  }
  else {
LAB_0016a207:
    uVar6 = ref_histogram_create((REF_HISTOGRAM *)nodes_1);
    if (uVar6 == 0) {
      uVar6 = ref_histogram_resolution((REF_HISTOGRAM)nodes_1._0_8_,0x120,12.0);
      if (uVar6 == 0) {
        uVar6 = ref_histogram_add_ratio((REF_HISTOGRAM)nodes_1._0_8_,ref_grid);
        if (uVar6 == 0) {
          if ((ref_grid->mpi->id == 0) &&
             (uVar6 = ref_histogram_zone((REF_HISTOGRAM)nodes_1._0_8_,pRVar2->hist_file,local_190,
                                         pRVar2->time), uVar6 != 0)) {
            uStackY_1d0 = (ulong)uVar6;
            pcVar20 = "tec zone";
            uVar16 = 0x358;
          }
          else {
            uVar6 = ref_histogram_free((REF_HISTOGRAM)nodes_1._0_8_);
            if (uVar6 == 0) {
              uVar6 = ref_node_synchronize_globals(pRVar13);
              if (uVar6 != 0) {
                uStackY_1d0 = (ulong)uVar6;
                pcVar20 = "sync";
                uVar16 = 0x375;
                goto LAB_0016a3a4;
              }
              uVar6 = ref_grid_compact_cell_nodes(ref_grid,pRVar3,&nnode,&ncell,&l2c);
              if (uVar6 != 0) {
                uStackY_1d0 = (ulong)uVar6;
                pcVar20 = "l2c";
                uVar16 = 0x378;
                goto LAB_0016a3a4;
              }
              if (ref_grid->mpi->id == 0) {
                if (pRVar2->grid_file == (FILE *)0x0) {
                  pFVar8 = fopen("ref_gather_movie.tec","w");
                  pRVar2->grid_file = (FILE *)pFVar8;
                  if (pFVar8 == (FILE *)0x0) {
                    puts("unable to open ref_gather_movie.tec");
                    pFVar8 = (FILE *)pRVar2->grid_file;
                    if (pFVar8 == (FILE *)0x0) {
                      pcVar20 = "unable to open file";
                      uVar16 = 0x37f;
                      goto LAB_0016a677;
                    }
                  }
                  fwrite("title=\"tecplot refine partition file\"\n",0x26,1,pFVar8);
                  fwrite("variables = \"x\" \"y\" \"z\" \"n\" \"s\" \"l\" \"p\"\n",0x28,1,
                         (FILE *)pRVar2->grid_file);
                }
                if (local_190 == (char *)0x0) {
                  pcVar18 = 
                  "zone t=\"surf\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                  ;
                  pcVar21 = "fetriangle";
                  RVar15 = ncell;
                  pcVar20 = (char *)nnode;
                  pcVar19 = "point";
                }
                else {
                  pcVar18 = 
                  "zone t=\"%s\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                  ;
                  pcVar21 = "point";
                  RVar15 = nnode;
                  pcVar20 = local_190;
                  pcVar19 = (char *)ncell;
                }
                fprintf((FILE *)pRVar2->grid_file,pcVar18,pRVar2->time,pcVar20,RVar15,pcVar19,
                        pcVar21);
              }
              pRVar17 = (REF_GLOB *)(long)pRVar13->max;
              if ((long)pRVar17 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x396,"ref_gather_tec_movie_frame","malloc scalar of REF_DBL negative");
                return 1;
              }
              local_158 = (REF_DBL *)malloc((ulong)(uint)(pRVar13->max * 4) << 3);
              if (local_158 == (REF_DBL *)0x0) {
                pcVar20 = "malloc scalar of REF_DBL NULL";
                uVar16 = 0x396;
LAB_0016a677:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar16,"ref_gather_tec_movie_frame",pcVar20);
                return 2;
              }
              uVar9 = 2;
              for (lVar11 = 0; (long)pRVar17 * 4 - lVar11 != 0; lVar11 = lVar11 + 4) {
                if (-1 < *(long *)((long)pRVar13->global + lVar11 * 2)) {
                  local_158[lVar11] = 2.0;
                  (local_158 + lVar11)[1] = 1.0;
                  local_158[lVar11 + 2] = 1.0;
                  local_158[lVar11 + 3] = (double)*(int *)((long)pRVar13->part + lVar11);
                }
              }
              local_198 = pRVar13;
              local_178 = pRVar17;
              if (pRVar4->model == (void *)0x0) {
                if (ref_grid->twod != 0) {
                  if (pRVar4->meshlink != (void *)0x0) goto LAB_0016a5a0;
                  goto LAB_0016a693;
                }
              }
              else {
LAB_0016a5a0:
                for (iVar22 = 0; iVar22 < pRVar3->max; iVar22 = iVar22 + 1) {
                  RVar7 = ref_cell_nodes(pRVar3,iVar22,nodes);
                  if (RVar7 == 0) {
                    uVar6 = ref_geom_tri_norm_deviation(ref_grid,nodes,&dot);
                    if (uVar6 != 0) {
                      pcVar20 = "norm dev";
                      uVar16 = 0x3a0;
                      goto LAB_0016a934;
                    }
                    uVar24 = (ulong)(uint)pRVar3->node_per;
                    if (pRVar3->node_per < 1) {
                      uVar24 = 0;
                    }
                    for (uVar12 = 0; uVar24 != uVar12; uVar12 = uVar12 + 1) {
                      dVar25 = local_158[(long)nodes[uVar12] * 4];
                      if (dot <= local_158[(long)nodes[uVar12] * 4]) {
                        dVar25 = dot;
                      }
                      local_158[(long)nodes[uVar12] * 4] = dVar25;
                    }
                  }
                }
                if (ref_grid->twod != 0) {
LAB_0016a693:
                  for (iVar22 = 0; iVar22 < pRVar3->max; iVar22 = iVar22 + 1) {
                    RVar7 = ref_cell_nodes(pRVar3,iVar22,nodes);
                    if (RVar7 == 0) {
                      uVar6 = ref_node_tri_quality(local_198,nodes,&quality);
                      if (uVar6 != 0) {
                        pcVar20 = "tri qual";
                        uVar16 = 0x3a9;
                        goto LAB_0016a934;
                      }
                      uVar24 = (ulong)(uint)pRVar3->node_per;
                      if (pRVar3->node_per < 1) {
                        uVar24 = 0;
                      }
                      for (uVar12 = 0; uVar24 != uVar12; uVar12 = uVar12 + 1) {
                        dVar25 = local_158[(long)nodes[uVar12] * 4];
                        if (quality <= local_158[(long)nodes[uVar12] * 4]) {
                          dVar25 = quality;
                        }
                        local_158[(long)nodes[uVar12] * 4] = dVar25;
                      }
                    }
                  }
                }
                uVar6 = ref_edge_create(&ref_edge,ref_grid);
                if (uVar6 != 0) {
                  pcVar20 = "create edges";
                  uVar16 = 0x3b0;
                  goto LAB_0016a982;
                }
                pRVar13 = (REF_NODE)0x0;
                while ((long)pRVar13 < (long)ref_edge->n) {
                  node0 = ref_edge->e2n[(long)pRVar13 * 2];
                  iVar22 = ref_edge->e2n[(long)pRVar13 * 2 + 1];
                  local_1a0 = pRVar13;
                  uVar6 = ref_node_ratio(local_198,node0,iVar22,&edge_ratio);
                  if (uVar6 != 0) {
                    pcVar20 = "ratio";
                    uVar16 = 0x3b4;
LAB_0016a934:
                    uStackY_1d0 = (ulong)uVar6;
                    goto LAB_0016a3a7;
                  }
                  dVar25 = local_158[(long)node0 * 4 + 1];
                  dVar5 = (local_158 + (long)node0 * 4 + 1)[1];
                  uVar24 = -(ulong)(dVar25 < edge_ratio);
                  uVar12 = -(ulong)(edge_ratio < dVar5);
                  local_158[(long)node0 * 4 + 1] =
                       (REF_DBL)(~uVar24 & (ulong)edge_ratio | (ulong)dVar25 & uVar24);
                  (local_158 + (long)node0 * 4 + 1)[1] =
                       (REF_DBL)(~uVar12 & (ulong)edge_ratio | (ulong)dVar5 & uVar12);
                  dVar25 = local_158[(long)iVar22 * 4 + 1];
                  dVar5 = (local_158 + (long)iVar22 * 4 + 1)[1];
                  uVar24 = -(ulong)(dVar25 < edge_ratio);
                  uVar12 = -(ulong)(edge_ratio < dVar5);
                  local_158[(long)iVar22 * 4 + 1] =
                       (REF_DBL)(~uVar24 & (ulong)edge_ratio | (ulong)dVar25 & uVar24);
                  (local_158 + (long)iVar22 * 4 + 1)[1] =
                       (REF_DBL)(~uVar12 & (ulong)edge_ratio | (ulong)dVar5 & uVar12);
                  pRVar13 = (REF_NODE)((long)&local_1a0->n + 1);
                }
                uVar6 = ref_edge_free(ref_edge);
                if (uVar6 != 0) {
                  pcVar20 = "free edges";
                  uVar16 = 0x3ba;
                  goto LAB_0016a982;
                }
              }
              pRVar13 = local_198;
              uVar6 = ref_gather_node_tec_part(local_198,nnode,l2c,4,local_158,pRVar2->grid_file);
              if (uVar6 != 0) {
                pcVar20 = "nodes";
                uVar16 = 0x3d3;
LAB_0016a982:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar16,"ref_gather_tec_movie_frame",(ulong)uVar6,pcVar20);
                return uVar6;
              }
              uVar6 = ref_gather_cell_tec(pRVar13,pRVar3,ncell,l2c,0,pRVar2->grid_file);
              if (uVar6 != 0) {
                pcVar20 = "t";
                uVar16 = 0x3d6;
                goto LAB_0016a982;
              }
              free(l2c);
              if (pRVar2->low_quality_zone == 0) goto LAB_0016b4f3;
              local_1a0 = ref_grid->node;
              lVar11 = (long)local_1a0->max;
              if (lVar11 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x51,"ref_gather_cell_below_quality","malloc *l2c of REF_GLOB negative");
                uStackY_1d0 = 1;
              }
              else {
                pRVar3 = ref_grid->cell[8];
                local_180 = (void *)pRVar2->min_quality;
                local_1b0 = ref_grid->mpi;
                l2c = (REF_GLOB *)malloc(lVar11 * 8);
                if (l2c == (REF_GLOB *)0x0) {
                  pcVar20 = "malloc *l2c of REF_GLOB NULL";
                  uStackY_1d0 = 0x51;
LAB_0016abce:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,uStackY_1d0,"ref_gather_cell_below_quality",pcVar20);
                  uStackY_1d0 = uVar9;
                }
                else {
                  for (lVar14 = 0; lVar11 != lVar14; lVar14 = lVar14 + 1) {
                    l2c[lVar14] = -1;
                  }
                  nnode = 0;
                  ncell = 0;
                  nnode_1 = 0;
                  iVar23 = 0;
                  local_188 = local_188 & 0xffffffff00000000;
                  for (iVar22 = 0; iVar22 < pRVar3->max; iVar22 = iVar22 + 1) {
                    RVar7 = ref_cell_nodes(pRVar3,iVar22,nodes_1);
                    if (RVar7 == 0) {
                      uVar6 = ref_cell_part(pRVar3,local_1a0,iVar22,&part);
                      if (uVar6 != 0) {
                        uVar9 = (ulong)uVar6;
                        pcVar20 = "part";
                        uStackY_1d0 = 0x59;
                        goto LAB_0016ac82;
                      }
                      if (local_1b0->id == part) {
                        uVar6 = ref_node_tet_quality(local_1a0,nodes_1,&local_160);
                        if (uVar6 != 0) {
                          uVar9 = (ulong)uVar6;
                          pcVar20 = "qual";
                          uStackY_1d0 = 0x5b;
                          goto LAB_0016ac82;
                        }
                        if (local_160 < (double)local_180) {
                          uVar9 = (ulong)(uint)pRVar3->node_per;
                          if (pRVar3->node_per < 1) {
                            uVar9 = 0;
                          }
                          for (uVar24 = 0; uVar9 != uVar24; uVar24 = uVar24 + 1) {
                            iVar1 = nodes_1[uVar24];
                            if ((local_1a0->ref_mpi->id == local_1a0->part[iVar1]) &&
                               (l2c[iVar1] == -1)) {
                              l2c[iVar1] = (long)iVar23;
                              iVar23 = iVar23 + 1;
                              nnode_1 = iVar23;
                            }
                          }
                          local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 1);
                        }
                      }
                    }
                  }
                  ncell = (REF_LONG)(int)local_188;
                  uVar9 = 1;
                  uVar6 = ref_mpi_allsum(local_1b0,&ncell,1,2);
                  if (uVar6 == 0) {
                    if ((long)local_1b0->n < 0) {
                      pcVar20 = "malloc counts of REF_INT negative";
                      uStackY_1d0 = 0x6c;
                      goto LAB_0016abce;
                    }
                    pvVar10 = malloc((long)local_1b0->n << 2);
                    if (pvVar10 == (void *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x6c,"ref_gather_cell_below_quality","malloc counts of REF_INT NULL");
                      uStackY_1d0 = 2;
                      goto LAB_0016ac8d;
                    }
                    uVar6 = ref_mpi_allgather(local_1b0,&nnode_1,pvVar10,1);
                    if (uVar6 == 0) {
                      uVar24 = 0;
                      uVar9 = (ulong)(uint)local_1b0->id;
                      if (local_1b0->id < 1) {
                        uVar9 = uVar24;
                      }
                      lVar11 = 0;
                      for (; uVar9 != uVar24; uVar24 = uVar24 + 1) {
                        lVar11 = lVar11 + *(int *)((long)pvVar10 + uVar24 * 4);
                      }
                      uVar24 = 0;
                      uVar9 = (ulong)(uint)local_1b0->n;
                      if (local_1b0->n < 1) {
                        uVar9 = uVar24;
                      }
                      for (; uVar9 != uVar24; uVar24 = uVar24 + 1) {
                        nnode = nnode + *(int *)((long)pvVar10 + uVar24 * 4);
                      }
                      free(pvVar10);
                      uVar24 = 0;
                      uVar9 = (ulong)(uint)local_1a0->max;
                      if (local_1a0->max < 1) {
                        uVar9 = uVar24;
                      }
                      for (; uVar9 != uVar24; uVar24 = uVar24 + 1) {
                        if (l2c[uVar24] != -1) {
                          l2c[uVar24] = l2c[uVar24] + lVar11;
                        }
                      }
                      uVar6 = ref_node_ghost_glob(local_1a0,l2c,1);
                      if (uVar6 == 0) {
                        if (ncell < 1 || (int)local_178 == 0) {
LAB_0016b4e9:
                          free(l2c);
LAB_0016b4f3:
                          if (ref_grid->mpi->id == 0) {
                            iVar22 = fflush((FILE *)pRVar2->grid_file);
                            if (iVar22 != 0) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x3fc,"ref_gather_tec_movie_frame","gather movie fflush",0,
                                     (long)iVar22);
                              return 1;
                            }
                            pRVar2->time = pRVar2->time + 1.0;
                          }
                          free(local_158);
                          return 0;
                        }
                        if (ref_grid->mpi->id == 0) {
                          if (local_190 == (char *)0x0) {
                            pcVar18 = 
                            "zone t=\"qtet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                            ;
                            pcVar21 = "fetetrahedron";
                            RVar15 = ncell;
                            pcVar20 = (char *)nnode;
                            pcVar19 = "point";
                          }
                          else {
                            pcVar18 = 
                            "zone t=\"q%s\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                            ;
                            pcVar21 = "point";
                            RVar15 = nnode;
                            pcVar20 = local_190;
                            pcVar19 = (char *)ncell;
                          }
                          fprintf((FILE *)pRVar2->grid_file,pcVar18,pRVar2->time,pcVar20,RVar15,
                                  pcVar19,pcVar21);
                        }
                        uVar6 = ref_gather_node_tec_part
                                          (local_198,nnode,l2c,4,local_158,pRVar2->grid_file);
                        if (uVar6 != 0) {
                          uStackY_1d0 = (ulong)uVar6;
                          pcVar20 = "nodes";
                          uVar16 = 0x3f2;
                          goto LAB_0016a3a4;
                        }
                        pRVar3 = ref_grid->cell[8];
                        local_140 = ncell;
                        local_178 = l2c;
                        local_180 = (void *)pRVar2->min_quality;
                        local_1b0 = local_198->ref_mpi;
                        uVar6 = pRVar3->node_per;
                        local_188 = (ulong)(int)uVar6;
                        iVar22 = 0;
                        if (local_1b0->id == 0) {
                          local_190 = (char *)0x0;
                          if (0 < (int)uVar6) {
                            local_190 = (char *)(ulong)uVar6;
                          }
                          pFVar8 = (FILE *)pRVar2->grid_file;
                          local_148 = 0;
                          local_1a0 = (REF_NODE)((ulong)local_1a0 & 0xffffffff00000000);
                          while ((int)local_1a0 < pRVar3->max) {
                            RVar7 = ref_cell_nodes(pRVar3,(int)local_1a0,nodes_1);
                            if (RVar7 == 0) {
                              uVar6 = ref_cell_part(pRVar3,local_198,(int)local_1a0,&nnode_1);
                              if (uVar6 != 0) {
                                uStackY_1d0 = (ulong)uVar6;
                                pcVar20 = "part";
                                uVar16 = 0x2f9;
                                goto LAB_0016b616;
                              }
                              if (local_1b0->id == nnode_1) {
                                uVar6 = ref_node_tet_quality(local_198,nodes_1,&local_160);
                                if (uVar6 != 0) {
                                  uStackY_1d0 = (ulong)uVar6;
                                  pcVar20 = "qual";
                                  uVar16 = 0x2fb;
                                  goto LAB_0016b616;
                                }
                                if (local_160 < (double)local_180) {
                                  for (pcVar20 = (char *)0x0; local_190 != pcVar20;
                                      pcVar20 = pcVar20 + 1) {
                                    fprintf(pFVar8," %ld",local_178[nodes_1[(long)pcVar20]] + 1);
                                  }
                                  local_148 = local_148 + 1;
                                  fputc(10,pFVar8);
                                }
                              }
                            }
                            local_1a0 = (REF_NODE)CONCAT44(local_1a0._4_4_,(int)local_1a0 + 1);
                          }
                          if (local_1b0->id != 0) goto LAB_0016aee7;
                          local_1a0 = (REF_NODE)(local_188 * 8);
                          uStackY_1d0 = 2;
                          local_178 = (REF_GLOB *)CONCAT44(local_178._4_4_,1);
                          while ((int)local_178 < local_1b0->n) {
                            uVar6 = ref_mpi_gather_recv(local_1b0,&part,1,1,(int)local_178);
                            if (uVar6 != 0) {
                              pcVar20 = "recv ncell";
                              uVar16 = 0x30c;
LAB_0016b5e4:
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,uVar16,"ref_gather_cell_quality_tec",(ulong)uVar6,pcVar20);
                              uStackY_1d0 = (ulong)uVar6;
                              goto LAB_0016b620;
                            }
                            uVar6 = part * (int)local_188;
                            if ((int)uVar6 < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x30d,"ref_gather_cell_quality_tec",
                                     "malloc c2n of REF_GLOB negative");
                              goto LAB_0016b4e1;
                            }
                            local_180 = malloc((ulong)uVar6 << 3);
                            if (local_180 == (void *)0x0) {
                              pcVar20 = "malloc c2n of REF_GLOB NULL";
                              uVar16 = 0x30d;
                              goto LAB_0016b37c;
                            }
                            uVar6 = ref_mpi_gather_recv(local_1b0,local_180,uVar6,2,(int)local_178);
                            if (uVar6 != 0) {
                              pcVar20 = "recv c2n";
                              uVar16 = 0x310;
                              goto LAB_0016b5e4;
                            }
                            pvVar10 = local_180;
                            for (local_198 = (REF_NODE)0x0; (long)local_198 < (long)part;
                                local_198 = (REF_NODE)((long)&local_198->n + 1)) {
                              for (pcVar20 = (char *)0x0; local_190 != pcVar20;
                                  pcVar20 = pcVar20 + 1) {
                                *(long *)((long)pvVar10 + (long)pcVar20 * 8) =
                                     *(long *)((long)pvVar10 + (long)pcVar20 * 8) + 1;
                                fprintf(pFVar8," %ld");
                              }
                              fputc(10,pFVar8);
                              pvVar10 = (void *)((long)pvVar10 + (long)local_1a0);
                            }
                            local_148 = local_148 + 1;
                            free(local_180);
                            local_178 = (REF_GLOB *)CONCAT44(local_178._4_4_,(int)local_178 + 1);
                          }
LAB_0016b488:
                          if ((local_1b0->id != 0) || (local_148 == local_140)) goto LAB_0016b4e9;
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x338,"ref_gather_cell_quality_tec","cell count mismatch",
                                 local_140,local_148);
LAB_0016b4e1:
                          uStackY_1d0 = 1;
                        }
                        else {
                          local_148 = 0;
LAB_0016aee7:
                          part = 0;
                          for (; iVar22 < pRVar3->max; iVar22 = iVar22 + 1) {
                            RVar7 = ref_cell_nodes(pRVar3,iVar22,nodes_1);
                            if (RVar7 == 0) {
                              uVar6 = ref_cell_part(pRVar3,local_198,iVar22,&nnode_1);
                              if (uVar6 != 0) {
                                uStackY_1d0 = (ulong)uVar6;
                                pcVar20 = "part";
                                uVar16 = 0x31e;
                                goto LAB_0016b616;
                              }
                              if (local_1b0->id == nnode_1) {
                                uVar6 = ref_node_tet_quality(local_198,nodes_1,&local_160);
                                if (uVar6 != 0) {
                                  uStackY_1d0 = (ulong)uVar6;
                                  pcVar20 = "qual";
                                  uVar16 = 800;
                                  goto LAB_0016b616;
                                }
                                if (local_160 < (double)local_180) {
                                  part = part + 1;
                                }
                              }
                            }
                          }
                          uStackY_1d0 = 1;
                          uVar6 = ref_mpi_gather_send(local_1b0,&part,1,1);
                          if (uVar6 == 0) {
                            if (part * (int)local_188 < 0) {
                              pcVar20 = "malloc c2n of REF_GLOB negative";
                              uVar16 = 0x325;
LAB_0016b37c:
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,uVar16,"ref_gather_cell_quality_tec",pcVar20);
                            }
                            else {
                              local_190 = (char *)malloc((ulong)(uint)(part * (int)local_188) << 3);
                              if (local_190 == (char *)0x0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                       ,0x325,"ref_gather_cell_quality_tec",
                                       "malloc c2n of REF_GLOB NULL");
                                uStackY_1d0 = 2;
                              }
                              else {
                                part = 0;
                                uVar9 = 0;
                                iVar22 = 0;
                                if (0 < (int)local_188) {
                                  uVar9 = local_188 & 0xffffffff;
                                  iVar22 = 0;
                                }
                                for (; iVar22 < pRVar3->max; iVar22 = iVar22 + 1) {
                                  RVar7 = ref_cell_nodes(pRVar3,iVar22,nodes_1);
                                  if (RVar7 == 0) {
                                    uVar6 = ref_cell_part(pRVar3,local_198,iVar22,&nnode_1);
                                    if (uVar6 != 0) {
                                      uStackY_1d0 = (ulong)uVar6;
                                      pcVar20 = "part";
                                      uVar16 = 0x328;
                                      goto LAB_0016b616;
                                    }
                                    if (local_1b0->id == nnode_1) {
                                      uVar6 = ref_node_tet_quality(local_198,nodes_1,&local_160);
                                      if (uVar6 != 0) {
                                        uStackY_1d0 = (ulong)uVar6;
                                        pcVar20 = "qual";
                                        uVar16 = 0x32a;
                                        goto LAB_0016b616;
                                      }
                                      if (local_160 < (double)local_180) {
                                        for (uVar24 = 0; uVar9 != uVar24; uVar24 = uVar24 + 1) {
                                          *(REF_GLOB *)
                                           (local_190 +
                                           uVar24 * 8 + (long)(part * (int)local_188) * 8) =
                                               local_178[nodes_1[uVar24]];
                                        }
                                        part = part + 1;
                                      }
                                    }
                                  }
                                }
                                uVar6 = ref_mpi_gather_send(local_1b0,local_190,
                                                            (int)local_188 * part,2);
                                if (uVar6 == 0) {
                                  free(local_190);
                                  goto LAB_0016b488;
                                }
                                uStackY_1d0 = (ulong)uVar6;
                                pcVar20 = "send c2n";
                                uVar16 = 0x333;
LAB_0016b616:
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                       ,uVar16,"ref_gather_cell_quality_tec",uStackY_1d0,pcVar20);
                              }
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x324,"ref_gather_cell_quality_tec",(ulong)uVar6,"send ncell");
                            uStackY_1d0 = (ulong)uVar6;
                          }
                        }
LAB_0016b620:
                        pcVar20 = "qtet";
                        uVar16 = 0x3f6;
                        goto LAB_0016a3a4;
                      }
                      uVar9 = (ulong)uVar6;
                      pcVar20 = "xfer";
                      uStackY_1d0 = 0x7b;
                    }
                    else {
                      uVar9 = (ulong)uVar6;
                      pcVar20 = "gather size";
                      uStackY_1d0 = 0x6d;
                    }
LAB_0016ac82:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,uStackY_1d0,"ref_gather_cell_below_quality",uVar9,pcVar20);
                    uStackY_1d0 = uVar9;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x6a,"ref_gather_cell_below_quality",(ulong)uVar6,"allsum");
                    uStackY_1d0 = (ulong)uVar6;
                  }
                }
              }
LAB_0016ac8d:
              pcVar20 = "cell below";
              uVar16 = 0x3dd;
              goto LAB_0016a3a4;
            }
            uStackY_1d0 = (ulong)uVar6;
            pcVar20 = "free gram";
            uVar16 = 0x35b;
          }
        }
        else {
          uStackY_1d0 = (ulong)uVar6;
          pcVar20 = "add ratio";
          uVar16 = 0x353;
        }
      }
      else {
        uStackY_1d0 = (ulong)uVar6;
        pcVar20 = "res";
        uVar16 = 0x351;
      }
    }
    else {
      uStackY_1d0 = (ulong)uVar6;
      pcVar20 = "create";
      uVar16 = 0x350;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar16
           ,"ref_gather_tec_histogram_frame",uStackY_1d0,pcVar20);
  }
  pcVar20 = "hist frame";
  uVar16 = 0x373;
LAB_0016a3a4:
  uVar6 = (uint)uStackY_1d0;
LAB_0016a3a7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar16,
         "ref_gather_tec_movie_frame",uStackY_1d0,pcVar20);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_gather_tec_movie_frame(REF_GRID ref_grid,
                                              const char *zone_title) {
  REF_GATHER ref_gather = ref_grid_gather(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_DBL *scalar, dot, quality;
  REF_INT edge, node0, node1;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  REF_INT ldim = 4;
  REF_BOOL metric_area = REF_FALSE;

  if (!(ref_gather->recording)) return REF_SUCCESS;

  RSS(ref_gather_tec_histogram_frame(ref_grid, zone_title), "hist frame");

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");

  if (ref_grid_once(ref_grid)) {
    if (NULL == (void *)(ref_gather->grid_file)) {
      ref_gather->grid_file = fopen("ref_gather_movie.tec", "w");
      if (NULL == (void *)(ref_gather->grid_file))
        printf("unable to open ref_gather_movie.tec\n");
      RNS(ref_gather->grid_file, "unable to open file");

      fprintf(ref_gather->grid_file,
              "title=\"tecplot refine partition file\"\n");
      fprintf(ref_gather->grid_file,
              "variables = \"x\" \"y\" \"z\" \"n\" \"s\" \"l\" \"p\"\n");
    }
    if (NULL == zone_title) {
      fprintf(ref_gather->grid_file,
              "zone t=\"surf\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s, solutiontime=%f\n",
              nnode, ncell, "point", "fetriangle", ref_gather->time);
    } else {
      fprintf(ref_gather->grid_file,
              "zone t=\"%s\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s, solutiontime=%f\n",
              zone_title, nnode, ncell, "point", "fetriangle",
              ref_gather->time);
    }
  }

  ref_malloc(scalar, ldim * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    scalar[0 + ldim * node] = 2.0;
    scalar[1 + ldim * node] = 1.0;
    scalar[2 + ldim * node] = 1.0;
    scalar[3 + ldim * node] = (REF_DBL)ref_node_part(ref_node, node);
  }
  if (ref_geom_model_loaded(ref_geom) || ref_grid_twod(ref_grid)) {
    if (ref_geom_model_loaded(ref_geom) || ref_geom_meshlinked(ref_geom)) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &dot), "norm dev");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[0 + ldim * nodes[cell_node]] =
              MIN(scalar[0 + ldim * nodes[cell_node]], dot);
        }
      }
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_node_tri_quality(ref_node, nodes, &quality), "tri qual");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[0 + ldim * nodes[cell_node]] =
              MIN(scalar[0 + ldim * nodes[cell_node]], quality);
        }
      }
    }
    RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
      scalar[1 + ldim * node0] = MIN(scalar[1 + ldim * node0], edge_ratio);
      scalar[1 + ldim * node1] = MIN(scalar[1 + ldim * node1], edge_ratio);
      scalar[2 + ldim * node0] = MAX(scalar[2 + ldim * node0], edge_ratio);
      scalar[2 + ldim * node1] = MAX(scalar[2 + ldim * node1], edge_ratio);
    }
    RSS(ref_edge_free(ref_edge), "free edges");
  }

  if (metric_area && ref_grid_twod(ref_grid)) {
    REF_DBL area;
    REF_INT i, *hits;
    ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
    each_ref_node_valid_node(ref_node, node) { scalar[3 + ldim * node] = 0.0; }
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
      for (i = 0; i < 3; i++) {
        scalar[3 + ldim * nodes[i]] += area;
        (hits[nodes[i]])++;
      }
    }
    each_ref_node_valid_node(ref_node, node) {
      if (hits[node] > 0) {
        scalar[3 + ldim * node] /= ((REF_DBL)hits[node]);
      }
    }
    ref_free(hits);
  }

  RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar,
                               ref_gather->grid_file),
      "nodes");
  RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE,
                          ref_gather->grid_file),
      "t");
  ref_free(l2c);

  if (ref_gather_low_quality_zone(ref_gather)) {
    RSS(ref_gather_cell_below_quality(ref_grid, ref_grid_tet(ref_grid),
                                      ref_gather->min_quality, &nnode, &ncell,
                                      &l2c),
        "cell below");

    if (node > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        if (NULL == zone_title) {
          fprintf(ref_gather->grid_file,
                  "zone t=\"qtet\", nodes=" REF_GLOB_FMT
                  ", elements=%ld, datapacking=%s, "
                  "zonetype=%s, solutiontime=%f\n",
                  nnode, ncell, "point", "fetetrahedron", ref_gather->time);
        } else {
          fprintf(ref_gather->grid_file,
                  "zone t=\"q%s\", nodes=" REF_GLOB_FMT
                  ", elements=%ld, datapacking=%s, "
                  "zonetype=%s, solutiontime=%f\n",
                  zone_title, nnode, ncell, "point", "fetetrahedron",
                  ref_gather->time);
        }
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar,
                                   ref_gather->grid_file),
          "nodes");
      RSS(ref_gather_cell_quality_tec(ref_node, ref_grid_tet(ref_grid), ncell,
                                      l2c, ref_gather->min_quality,
                                      ref_gather->grid_file),
          "qtet");
    }
    ref_free(l2c);
  }

  if (ref_grid_once(ref_grid)) {
    REIS(0, fflush(ref_gather->grid_file), "gather movie fflush");
    (ref_gather->time) += 1.0;
  }

  ref_free(scalar);

  return REF_SUCCESS;
}